

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

Rtm_Man_t * Rtm_ManAlloc(Aig_Man_t *p)

{
  int iVar1;
  Rtm_Man_t *__s;
  Vec_Ptr_t *pVVar2;
  Aig_MmFlex_t *pAVar3;
  Rtm_Man_t *pRtm;
  Aig_Man_t *p_local;
  
  __s = (Rtm_Man_t *)malloc(0x30);
  memset(__s,0,0x30);
  iVar1 = Aig_ManObjNum(p);
  pVVar2 = Vec_PtrAlloc(iVar1);
  __s->vObjs = pVVar2;
  iVar1 = Aig_ManCiNum(p);
  pVVar2 = Vec_PtrAlloc(iVar1);
  __s->vPis = pVVar2;
  iVar1 = Aig_ManCoNum(p);
  pVVar2 = Vec_PtrAlloc(iVar1);
  __s->vPos = pVVar2;
  pAVar3 = Aig_MmFlexStart();
  __s->pMem = pAVar3;
  return __s;
}

Assistant:

Rtm_Man_t * Rtm_ManAlloc( Aig_Man_t * p )
{
    Rtm_Man_t * pRtm;
    // start the manager
    pRtm = ABC_ALLOC( Rtm_Man_t, 1 );
    memset( pRtm, 0, sizeof(Rtm_Man_t) );
    // perform initializations
    pRtm->vObjs = Vec_PtrAlloc( Aig_ManObjNum(p) );
    pRtm->vPis  = Vec_PtrAlloc( Aig_ManCiNum(p) );
    pRtm->vPos  = Vec_PtrAlloc( Aig_ManCoNum(p) );
    pRtm->pMem  = Aig_MmFlexStart();
    return pRtm;
}